

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O2

void __thiscall cnn::RmsPropTrainer::update(RmsPropTrainer *this,real scale)

{
  Model *pMVar1;
  undefined8 *puVar2;
  long lVar3;
  Parameters *this_00;
  pointer pfVar4;
  LookupParameters *this_01;
  size_type __new_size;
  undefined8 *puVar5;
  RmsPropTrainer *pRVar6;
  ulong uVar7;
  uint uVar8;
  __node_base *p_Var9;
  RealScalar RVar10;
  float fVar11;
  float fVar12;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  reg;
  float local_184;
  RmsPropTrainer *local_180;
  float local_178;
  real local_174;
  undefined8 *local_170;
  undefined8 *local_168;
  Tensor *local_160;
  undefined8 *local_158;
  long *local_150;
  real *local_148;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>> local_140 [24];
  StorageBaseType local_128 [24];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  local_110;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  local_e0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>
  local_a8;
  
  local_180 = this;
  local_174 = scale;
  if (this->shadow_params_allocated == false) {
    pMVar1 = (this->super_Trainer).model;
    std::vector<float,_std::allocator<float>_>::resize
              (&this->hg,*(long *)(pMVar1 + 0x20) - *(long *)(pMVar1 + 0x18) >> 3);
    pMVar1 = (this->super_Trainer).model;
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize(&this->hlg,*(long *)(pMVar1 + 0x38) - *(long *)(pMVar1 + 0x30) >> 3);
    pMVar1 = (this->super_Trainer).model;
    puVar2 = *(undefined8 **)(pMVar1 + 0x38);
    uVar7 = 0;
    for (puVar5 = *(undefined8 **)(pMVar1 + 0x30); puVar5 != puVar2; puVar5 = puVar5 + 1) {
      lVar3 = *(long *)&this->hlg;
      __new_size = (**(code **)(*(long *)*puVar5 + 0x18))();
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)(uVar7 * 0x18 + lVar3),__new_size);
      uVar7 = (ulong)((int)uVar7 + 1);
    }
    local_180->shadow_params_allocated = true;
  }
  pRVar6 = local_180;
  local_178 = Trainer::clip_gradients(&local_180->super_Trainer);
  pMVar1 = (pRVar6->super_Trainer).model;
  local_168 = *(undefined8 **)(pMVar1 + 0x20);
  local_148 = &(pRVar6->super_Trainer).lambda;
  uVar8 = 0;
  puVar5 = *(undefined8 **)(pMVar1 + 0x18);
  while (puVar5 != local_168) {
    this_00 = (Parameters *)*puVar5;
    local_150 = (long *)CONCAT44(local_150._4_4_,uVar8);
    pfVar4 = (local_180->hg).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_160 = &this_00->values;
    local_158 = puVar5;
    Tensor::vec((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_a8,
                local_160);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::operator*
              (&local_110,
               (MatrixBase<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>> *)
               &local_a8,local_148);
    Tensor::vec((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_a8,
                &this_00->g);
    RVar10 = Eigen::
             MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>
             ::squaredNorm((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                            *)&local_a8);
    pRVar6 = local_180;
    fVar11 = RVar10 * (1.0 - local_180->rho) + pfVar4[uVar8] * local_180->rho;
    pfVar4[uVar8] = fVar11;
    fVar12 = (local_180->super_Trainer).eta * local_174;
    fVar11 = fVar11 + local_180->epsilon;
    if (fVar11 < 0.0) {
      local_170 = (undefined8 *)CONCAT44(local_170._4_4_,fVar12);
      fVar11 = sqrtf(fVar11);
      fVar12 = local_170._0_4_;
    }
    else {
      fVar11 = SQRT(fVar11);
    }
    uVar8 = (int)local_150 + 1;
    local_184 = (fVar12 * local_178) / fVar11;
    Tensor::vec((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_128,
                &this_00->g);
    Eigen::operator*(&local_e0,&local_184,local_128);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,1,0,-1,1>const>const,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const>>
    ::operator+(&local_a8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>>
                 *)&local_e0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>
                 *)&local_110);
    Tensor::vec((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_140,
                local_160);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::operator-=
              (local_140,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>_>
                *)&local_a8);
    Parameters::clear(this_00);
    puVar5 = local_158 + 1;
  }
  pMVar1 = (pRVar6->super_Trainer).model;
  local_170 = *(undefined8 **)(pMVar1 + 0x38);
  uVar8 = 0;
  for (local_160 = *(Tensor **)(pMVar1 + 0x30); local_160 != (Tensor *)local_170;
      local_160 = (Tensor *)((long)local_160 + 8)) {
    this_01 = *(LookupParameters **)local_160;
    local_168 = (undefined8 *)CONCAT44(local_168._4_4_,uVar8);
    local_150 = (long *)((ulong)uVar8 * 0x18 + *(long *)&pRVar6->hlg);
    p_Var9 = &(this_01->non_zero_grads)._M_h._M_before_begin;
    while (p_Var9 = p_Var9->_M_nxt, p_Var9 != (__node_base *)0x0) {
      uVar7 = (ulong)(uint)*(size_type *)(p_Var9 + 1);
      lVar3 = *local_150;
      Tensor::vec((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_a8,
                  (this_01->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar7);
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::
      operator*(&local_110,
                (MatrixBase<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>> *)
                &local_a8,local_148);
      Tensor::vec((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_a8,
                  (this_01->grads).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar7);
      RVar10 = Eigen::
               MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>
               ::squaredNorm((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                              *)&local_a8);
      fVar11 = RVar10 * (1.0 - local_180->rho) + *(float *)(lVar3 + uVar7 * 4) * local_180->rho;
      *(float *)(lVar3 + uVar7 * 4) = fVar11;
      fVar12 = (local_180->super_Trainer).eta * local_174;
      fVar11 = fVar11 + local_180->epsilon;
      if (fVar11 < 0.0) {
        local_158 = (undefined8 *)CONCAT44(local_158._4_4_,fVar12);
        fVar11 = sqrtf(fVar11);
        fVar12 = local_158._0_4_;
      }
      else {
        fVar11 = SQRT(fVar11);
      }
      local_184 = (fVar12 * local_178) / fVar11;
      Tensor::vec((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_128,
                  (this_01->grads).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar7);
      Eigen::operator*(&local_e0,&local_184,local_128);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,1,0,-1,1>const>const,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const>>
      ::operator+(&local_a8,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>>
                   *)&local_e0,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>
                   *)&local_110);
      Tensor::vec((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_140,
                  (this_01->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar7);
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::
      operator-=(local_140,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>_>
                  *)&local_a8);
    }
    uVar8 = (int)local_168 + 1;
    LookupParameters::clear(this_01);
    pRVar6 = local_180;
  }
  (pRVar6->super_Trainer).updates = (pRVar6->super_Trainer).updates + 1.0;
  return;
}

Assistant:

void RmsPropTrainer::update(real scale) {
  unsigned pi = 0;
  if (!shadow_params_allocated) {
    hg.resize(model->parameters_list().size());

    pi = 0;
    hlg.resize(model->lookup_parameters_list().size());
    for (auto p : model->lookup_parameters_list()) {
      hlg[pi++].resize(p->size());
    }

    shadow_params_allocated = true;
  }

  const float gscale = clip_gradients();
  pi = 0;
  for (auto p : model->parameters_list()) {
    real& d2 = hg[pi++];
    auto reg = p->values.vec() * lambda;
    real g2 = p->g.vec().squaredNorm();
    d2 = rho * d2 + (1.0 - rho) * g2;
    p->values.vec() -= ((eta * scale * gscale / sqrt(d2 + epsilon)) * p->g.vec() + reg);
    p->clear();
  }

  pi = 0;
  for (auto p : model->lookup_parameters_list()) {
    vector<real>& hlgx = hlg[pi++];
    for (auto i : p->non_zero_grads) {
      real& d2 = hlgx[i];
      auto reg = p->values[i].vec() * lambda;
      real g2 = p->grads[i].vec().squaredNorm();
      d2 = rho * d2 + (1.0 - rho) * g2;
      p->values[i].vec() -= ((eta * scale * gscale / sqrt(d2 + epsilon)) * p->grads[i].vec() + reg);
    }
    p->clear();
  }
  ++updates;
}